

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpj.cpp
# Opt level: O3

void __thiscall pg::FPJSolver::runSeq(FPJSolver *this)

{
  ulong *puVar1;
  int *piVar2;
  char cVar3;
  void *__s;
  void *__s_00;
  uint *__s_01;
  long lVar4;
  ostream *poVar5;
  long *plVar6;
  Game *pGVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint *puVar12;
  uint uVar13;
  bool bVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  void *pvVar20;
  int to;
  uint uVar21;
  int local_84;
  ulong local_78;
  _label_vertex local_58;
  void *local_48;
  void *local_40;
  long local_38;
  
  pGVar7 = (this->super_Solver).game;
  uVar10 = pGVar7->n_vertices;
  local_40 = operator_new__(-(ulong)(uVar10 >> 0x3e != 0) | uVar10 * 4);
  uVar9 = uVar10 + 0x3f;
  uVar18 = uVar9 >> 3 & 0xfffffffffffffff8;
  __s = operator_new__(uVar18);
  if (0x3f < uVar9) {
    memset(__s,0,uVar18);
  }
  __s_00 = operator_new__(uVar18);
  if (0x3f < uVar9) {
    memset(__s_00,0,uVar18);
  }
  __s_01 = (uint *)operator_new__(uVar18);
  if ((0x3f < uVar9) && (memset(__s_01,0,uVar18), 0 < (long)uVar10)) {
    piVar2 = pGVar7->_priority;
    uVar9 = 0;
    do {
      uVar18 = uVar9 >> 6;
      uVar16 = 1L << (uVar9 & 0x3f);
      if ((*(byte *)(piVar2 + uVar9) & 1) == 0) {
        uVar16 = ~uVar16 & *(ulong *)(__s_01 + uVar18 * 2);
      }
      else {
        uVar16 = uVar16 | *(ulong *)(__s_01 + uVar18 * 2);
      }
      uVar9 = uVar9 + 1;
      *(ulong *)(__s_01 + uVar18 * 2) = uVar16;
    } while ((long)uVar9 < (long)uVar10);
  }
  local_48 = operator_new__(uVar10 * 4 & 0x3fffffffc);
  local_84 = 0;
  uVar13 = 0;
  uVar11 = 0;
  bVar14 = false;
  uVar19 = *__s_01 & 1;
  pvVar20 = local_40;
  do {
    pGVar7 = (this->super_Solver).game;
    local_78 = (ulong)(int)uVar11;
    if (pGVar7->n_vertices == local_78) {
LAB_0015ac6a:
      uVar19 = uVar11;
      if (bVar14) {
        while (local_84 != 0) {
          pGVar7 = (this->super_Solver).game;
          lVar4 = (long)local_84;
          local_84 = local_84 + -1;
          local_38 = (long)*(int *)((long)local_48 + lVar4 * 4 + -4);
          piVar2 = pGVar7->_inedges;
          lVar4 = (long)pGVar7->_firstins[local_38];
          uVar11 = piVar2[lVar4];
          if (uVar11 != 0xffffffff) {
            puVar12 = (uint *)(piVar2 + lVar4 + 1);
            do {
              uVar9 = (ulong)(long)(int)uVar11 >> 6;
              if ((((this->super_Solver).disabled)->_bits[uVar9] >> ((ulong)uVar11 & 0x3f) & 1) == 0
                 ) {
                uVar18 = 1L << ((ulong)uVar11 & 0x3f);
                uVar10 = *(ulong *)((long)__s + uVar9 * 8);
                if (((uVar10 & uVar18) != 0) &&
                   ((iVar8 = *(int *)((long)pvVar20 + (long)(int)uVar11 * 4), iVar8 == -1 ||
                    (iVar8 == (int)local_38)))) {
                  if (1 < (this->super_Solver).trace) {
                    poVar5 = (this->super_Solver).logger;
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar5,"\x1b[31;1mresetting\x1b[m ",0x14);
                    local_58.g = (this->super_Solver).game;
                    local_58.v = uVar11;
                    poVar5 = operator<<(poVar5,&local_58);
                    std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
                    std::ostream::put((char)poVar5);
                    std::ostream::flush();
                    uVar10 = *(ulong *)((long)__s + uVar9 * 8);
                    pvVar20 = local_40;
                  }
                  *(ulong *)((long)__s + uVar9 * 8) = ~uVar18 & uVar10;
                  puVar1 = (ulong *)((long)__s_00 + uVar9 * 8);
                  *puVar1 = *puVar1 & ~uVar18;
                  lVar4 = (long)local_84;
                  local_84 = local_84 + 1;
                  *(uint *)((long)local_48 + lVar4 * 4) = uVar11;
                  if ((int)uVar11 < (int)uVar19) {
                    uVar19 = uVar11;
                  }
                }
              }
              uVar11 = *puVar12;
              puVar12 = puVar12 + 1;
            } while (uVar11 != 0xffffffff);
          }
        }
        if ((this->super_Solver).trace != 0) {
          poVar5 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,"restarting after finding distractions of prio ",0x2e);
          plVar6 = (long *)std::ostream::operator<<
                                     (poVar5,((this->super_Solver).game)->_priority
                                             [(long)(int)uVar19 + -1]);
          std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
          std::ostream::put((char)plVar6);
          std::ostream::flush();
        }
        this->iterations = this->iterations + 1;
        uVar11 = uVar13;
        if ((int)uVar19 < (int)uVar13) {
          uVar11 = uVar19;
        }
        local_84 = 0;
        local_78 = (ulong)(int)uVar11;
      }
      else if ((int)uVar13 < (int)uVar11) {
        uVar9 = (ulong)(int)uVar13;
        do {
          uVar10 = uVar9 >> 6;
          if ((((this->super_Solver).disabled)->_bits[uVar10] >> (uVar9 & 0x3f) & 1) == 0) {
            uVar16 = 1L << (uVar9 & 0x3f);
            uVar18 = *(ulong *)((long)__s + uVar10 * 8);
            if (((uVar18 & uVar16) == 0) &&
               (*(ulong *)((long)__s + uVar10 * 8) = uVar18 | uVar16, 1 < (this->super_Solver).trace
               )) {
              poVar5 = (this->super_Solver).logger;
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar5,"\x1b[38;5;165;1mjustified\x1b[m ",0x1a);
              local_58.g = (this->super_Solver).game;
              local_58.v = (int)uVar9;
              operator<<(poVar5,&local_58);
              uVar13 = *(uint *)((long)pvVar20 + uVar9 * 4);
              if (uVar13 != 0xffffffff) {
                poVar5 = (this->super_Solver).logger;
                std::__ostream_insert<char,std::char_traits<char>>(poVar5," => ",4);
                local_58.g = (this->super_Solver).game;
                local_58.v = uVar13;
                operator<<(poVar5,&local_58);
              }
              poVar5 = (this->super_Solver).logger;
              cVar3 = (char)poVar5;
              std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + cVar3);
              std::ostream::put(cVar3);
              std::ostream::flush();
            }
          }
          uVar9 = uVar9 + 1;
        } while (uVar11 != (uint)uVar9);
      }
      pGVar7 = (this->super_Solver).game;
      if (pGVar7->n_vertices == local_78) {
        pGVar7 = (this->super_Solver).game;
        lVar4 = pGVar7->n_vertices;
        if (0 < lVar4) {
          uVar9 = 0;
          do {
            uVar10 = uVar9 >> 6;
            if ((((this->super_Solver).disabled)->_bits[uVar10] >> (uVar9 & 0x3f) & 1) == 0) {
              uVar18 = 1L << (uVar9 & 0x3f);
              bVar14 = ((*(ulong *)((long)__s_00 + uVar10 * 8) & uVar18) != 0) !=
                       ((*(ulong *)(__s_01 + uVar10 * 2) & uVar18) != 0);
              iVar8 = -1;
              if (bVar14 != (((pGVar7->_owner)._bits[uVar10] & uVar18) == 0)) {
                iVar8 = *(int *)((long)pvVar20 + uVar9 * 4);
              }
              Oink::solve((this->super_Solver).oink,(int)uVar9,(uint)bVar14,iVar8);
              pGVar7 = (this->super_Solver).game;
              lVar4 = pGVar7->n_vertices;
              pvVar20 = local_40;
            }
            uVar9 = uVar9 + 1;
          } while ((long)uVar9 < lVar4);
        }
        operator_delete__(pvVar20);
        poVar5 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"solved with ",0xc);
        poVar5 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," iterations.",0xc);
        std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        operator_delete__(local_48);
        operator_delete__(__s_01);
        operator_delete__(__s_00);
        operator_delete__(__s);
        return;
      }
      uVar9 = local_78 >> 6;
      bVar14 = false;
      uVar10 = 1L << (local_78 & 0x3f);
      uVar19 = (uint)((*(ulong *)(__s_01 + uVar9 * 2) >> (local_78 & 0x3f) & 1) != 0);
      uVar13 = uVar11;
LAB_0015b02c:
      uVar18 = *(ulong *)((long)__s + uVar9 * 8);
      if ((uVar10 & uVar18) == 0) {
        piVar2 = pGVar7->_outedges;
        lVar4 = (long)pGVar7->_firstouts[local_78];
        uVar21 = piVar2[lVar4];
        uVar16 = (ulong)uVar21;
        if (((pGVar7->_owner)._bits[uVar9] & uVar10) == 0) {
          uVar15 = 1;
          if (uVar21 != 0xffffffff) {
            puVar12 = (uint *)(piVar2 + lVar4 + 1);
            do {
              uVar21 = (uint)uVar16;
              uVar17 = (ulong)(long)(int)uVar21 >> 6;
              if (((((this->super_Solver).disabled)->_bits[uVar17] >> (uVar16 & 0x3f) & 1) == 0) &&
                 (uVar16 = 1L << (uVar16 & 0x3f),
                 ((*(ulong *)(__s_01 + uVar17 * 2) & uVar16) != 0) ==
                 ((*(ulong *)((long)__s_00 + uVar17 * 8) & uVar16) != 0))) {
                uVar15 = 0;
                goto LAB_0015b140;
              }
              uVar21 = *puVar12;
              uVar16 = (ulong)uVar21;
              puVar12 = puVar12 + 1;
            } while (uVar21 != 0xffffffff);
          }
        }
        else {
          uVar15 = 0;
          if (uVar21 != 0xffffffff) {
            puVar12 = (uint *)(piVar2 + lVar4 + 1);
            do {
              uVar21 = (uint)uVar16;
              uVar17 = (ulong)(long)(int)uVar21 >> 6;
              if (((((this->super_Solver).disabled)->_bits[uVar17] >> (uVar16 & 0x3f) & 1) == 0) &&
                 (uVar16 = 1L << (uVar16 & 0x3f),
                 ((*(ulong *)((long)__s_00 + uVar17 * 8) & uVar16) != 0) !=
                 ((*(ulong *)(__s_01 + uVar17 * 2) & uVar16) != 0))) {
                uVar15 = 1;
                goto LAB_0015b140;
              }
              uVar21 = *puVar12;
              uVar16 = (ulong)uVar21;
              puVar12 = puVar12 + 1;
              uVar15 = 0;
            } while (uVar21 != 0xffffffff);
          }
        }
        uVar21 = 0xffffffff;
LAB_0015b140:
        *(uint *)((long)pvVar20 + local_78 * 4) = uVar21;
        if (uVar19 != uVar15) {
          lVar4 = (long)local_84;
          local_84 = local_84 + 1;
          *(uint *)((long)local_48 + lVar4 * 4) = uVar11;
          puVar1 = (ulong *)((long)__s_00 + uVar9 * 8);
          *puVar1 = *puVar1 | uVar10;
          *(ulong *)((long)__s + uVar9 * 8) = uVar18 | uVar10;
          bVar14 = true;
          if (1 < (this->super_Solver).trace) {
            poVar5 = (this->super_Solver).logger;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,"\x1b[38;5;165;1mjustified*\x1b[m ",0x1b);
            local_58.g = (this->super_Solver).game;
            local_58.v = uVar11;
            operator<<(poVar5,&local_58);
            if (uVar21 != 0xffffffff) {
              poVar5 = (this->super_Solver).logger;
              std::__ostream_insert<char,std::char_traits<char>>(poVar5," => ",4);
              local_58.g = (this->super_Solver).game;
              local_58.v = uVar21;
              operator<<(poVar5,&local_58);
            }
            poVar5 = (this->super_Solver).logger;
            cVar3 = (char)poVar5;
            std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + cVar3);
            std::ostream::put(cVar3);
            std::ostream::flush();
          }
        }
      }
    }
    else {
      uVar9 = local_78 >> 6;
      if ((((this->super_Solver).disabled)->_bits[uVar9] >> (local_78 & 0x3f) & 1) == 0) {
        uVar10 = 1L << (local_78 & 0x3f);
        if (uVar19 != ((*(ulong *)(__s_01 + uVar9 * 2) & uVar10) != 0)) goto LAB_0015ac6a;
        goto LAB_0015b02c;
      }
    }
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

void
FPJSolver::runSeq()
{
    /**
     * Allocate and initialize data structures
     */

    int *strategy = new int[nodecount()]; // the current strategy
    bitset justified(nodecount()); // whether a vertex is justified
    bitset distraction(nodecount()); // whether a vertex is won by the opponent

    bitset parity(nodecount()); // optimization: precompute the parity of every vertex's priority
    for (int v=0; v<nodecount(); v++) parity[v] = priority(v)&1;

    uintqueue Q(nodecount());

    /**
     * Initialize loop
     */

    bool blockchanged = false; // did the current block change (new distractions)
    int cur_parity = parity[0]; // parity of current block
    int i = 0; // the current vertex
    int blockstart = 0; // first vertex of the current block

    for (;;) {
        /**
         * First detect if we are at the end of a block (vertices of same parity)
         */
        bool blockended = false;
        if (i == nodecount()) {
            blockended = true;
        } else {
            if (disabled[i]) { i++; continue; }
            if (parity[i] != cur_parity) blockended = true;
        }

        if (blockended) {
            if (blockchanged) {
                /**
                 * We have to reset all justified vertices that are now no longer justified...
                 */
                while (!Q.empty()) {
                    const int v = Q.pop();
                    for (auto curedge = ins(v); *curedge != -1; curedge++) {
                        const int from = *curedge;
                        if (disabled[from]) continue;
                        if (justified[from]) {
                            if (strategy[from] == -1 or strategy[from] == v) {
#ifndef NDEBUG
                                if (trace >= 2) logger << "\033[31;1mresetting\033[m " << label_vertex(from) << std::endl;
#endif
                                justified[from] = false;
                                distraction[from] = false; // reset it
                                Q.push(from);
                                if (from < i) i = from; // afterwards, continue at lowest unjustified vertex
                            }
                        }
                    }
                }
#ifndef NDEBUG
                if (trace) logger << "restarting after finding distractions of prio " << priority(i-1) << std::endl;
#endif
                iterations++;
                blockchanged = false;
                if (i > blockstart) i = blockstart;
            } else {
                // We now know that the current strategy of all unjustified vertices of the block is justified
                for (int v=blockstart; v<i; v++) {
                    if (!disabled[v] and !justified[v]) {
                        justified[v] = true;
#ifndef NDEBUG
                        if (trace >= 2) {
                            logger << "\033[38;5;165;1mjustified\033[m " << label_vertex(v);
                            if (strategy[v] != -1) logger << " => " << label_vertex(strategy[v]);
                            logger << std::endl;
                        }
#endif
                    }
                }
            }

            if (i == nodecount()) break; // in case the last block didn't result in unjustifications

            // continue with the new block, update the current parity
            cur_parity = parity[i];
            blockstart = i;
        }

        // if the current vertex is justified, we don't need to check it
        if (justified[i]) {
            i++;
            continue;
        }

        // compute one step winner of <i> and update the strategy
        int onestep_winner, str = -1;
        if (owner(i) == 0) {
            // see if player Even can go to a vertex currently good for Even
            onestep_winner = 1;
            for (auto curedge = outs(i); *curedge != -1; curedge++) {
                int to = *curedge;
                if (disabled[to]) continue;
                const int winner_to = parity[to] ^ distraction[to];
                if (winner_to == 0) {
                    // good for player Even
                    onestep_winner = 0;
                    // and set the strategy
                    str = to;
                    break;
                }
            }
        } else {
            // see if player Odd can go to a vertex currently good for Odd
            onestep_winner = 0;
            for (auto curedge = outs(i); *curedge != -1; curedge++) {
                int to = *curedge;
                if (disabled[to]) continue;
                const int winner_to = parity[to] ^ distraction[to];
                if (winner_to == 1) {
                    // good for player Odd
                    onestep_winner = 1;
                    // and set the strategy
                    str = to;
                    break;
                }
            }
        }

        strategy[i] = str;

        // evaluation stays the same
        if (cur_parity != onestep_winner) {
            Q.push(i); // add to the Queue, because all justified predecessors are now invalid
            distraction[i] = true;
            justified[i] = true;
            blockchanged = true;
#ifndef NDEBUG
            if (trace >= 2) {
                logger << "\033[38;5;165;1mjustified*\033[m " << label_vertex(i);
                if (strategy[i] != -1) logger << " => " << label_vertex(strategy[i]);
                logger << std::endl;
            }
#endif
        }

        i++;
    }

    // done
    for (int v=0; v<nodecount(); v++) {
        if (disabled[v]) continue;
        const int winner = parity[v] ^ distraction[v];
        Solver::solve(v, winner, winner == owner(v) ? strategy[v] : -1);
    }

    // free allocated data structures
    delete[] strategy;

    logger << "solved with " << iterations << " iterations." << std::endl;
}